

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall cbtQuantizedBvh::swapLeafNodes(cbtQuantizedBvh *this,int i,int splitIndex)

{
  cbtQuantizedBvhNode *pcVar1;
  cbtOptimizedBvhNode *pcVar2;
  cbtQuantizedBvhNode *pcVar3;
  cbtOptimizedBvhNode *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  unsigned_short uVar16;
  unsigned_short uVar17;
  unsigned_short uVar18;
  unsigned_short uVar19;
  unsigned_short uVar20;
  unsigned_short uVar21;
  unsigned_short uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  cbtQuantizedBvhNode tmp;
  
  if (this->m_useQuantization == true) {
    pcVar3 = (this->m_quantizedLeafNodes).m_data;
    pcVar1 = pcVar3 + i;
    uVar19 = pcVar1->m_quantizedAabbMin[0];
    uVar20 = pcVar1->m_quantizedAabbMin[1];
    uVar21 = pcVar1->m_quantizedAabbMin[2];
    uVar22 = pcVar1->m_quantizedAabbMax[0];
    uVar5 = *(undefined8 *)(pcVar1->m_quantizedAabbMax + 1);
    pcVar1 = pcVar3 + splitIndex;
    uVar16 = pcVar1->m_quantizedAabbMin[1];
    uVar17 = pcVar1->m_quantizedAabbMin[2];
    uVar18 = pcVar1->m_quantizedAabbMax[0];
    uVar6 = *(undefined8 *)(pcVar1->m_quantizedAabbMax + 1);
    pcVar3 = pcVar3 + i;
    pcVar3->m_quantizedAabbMin[0] = pcVar1->m_quantizedAabbMin[0];
    pcVar3->m_quantizedAabbMin[1] = uVar16;
    pcVar3->m_quantizedAabbMin[2] = uVar17;
    pcVar3->m_quantizedAabbMax[0] = uVar18;
    *(undefined8 *)(pcVar3->m_quantizedAabbMax + 1) = uVar6;
    pcVar1 = (this->m_quantizedLeafNodes).m_data + splitIndex;
    pcVar1->m_quantizedAabbMin[0] = uVar19;
    pcVar1->m_quantizedAabbMin[1] = uVar20;
    pcVar1->m_quantizedAabbMin[2] = uVar21;
    pcVar1->m_quantizedAabbMax[0] = uVar22;
    *(undefined8 *)(pcVar1->m_quantizedAabbMax + 1) = uVar5;
    return;
  }
  pcVar4 = (this->m_leafNodes).m_data;
  pcVar2 = pcVar4 + i;
  uVar5 = *(undefined8 *)(pcVar2->m_aabbMinOrg).m_floats;
  uVar6 = *(undefined8 *)((pcVar2->m_aabbMinOrg).m_floats + 2);
  uVar7 = *(undefined8 *)(pcVar2->m_aabbMaxOrg).m_floats;
  uVar8 = *(undefined8 *)((pcVar2->m_aabbMaxOrg).m_floats + 2);
  iVar30 = pcVar2->m_escapeIndex;
  iVar31 = pcVar2->m_subPart;
  iVar32 = pcVar2->m_triangleIndex;
  cVar33 = pcVar2->m_padding[0];
  cVar34 = pcVar2->m_padding[1];
  cVar35 = pcVar2->m_padding[2];
  cVar36 = pcVar2->m_padding[3];
  uVar9 = *(undefined8 *)(pcVar2->m_padding + 4);
  uVar10 = *(undefined8 *)(pcVar2->m_padding + 0xc);
  pcVar2 = pcVar4 + splitIndex;
  uVar11 = *(undefined8 *)((pcVar2->m_aabbMinOrg).m_floats + 2);
  uVar12 = *(undefined8 *)(pcVar2->m_aabbMaxOrg).m_floats;
  uVar13 = *(undefined8 *)((pcVar2->m_aabbMaxOrg).m_floats + 2);
  iVar23 = pcVar2->m_escapeIndex;
  iVar24 = pcVar2->m_subPart;
  iVar25 = pcVar2->m_triangleIndex;
  cVar26 = pcVar2->m_padding[0];
  cVar27 = pcVar2->m_padding[1];
  cVar28 = pcVar2->m_padding[2];
  cVar29 = pcVar2->m_padding[3];
  uVar14 = *(undefined8 *)(pcVar2->m_padding + 4);
  uVar15 = *(undefined8 *)(pcVar2->m_padding + 0xc);
  pcVar4 = pcVar4 + i;
  *(undefined8 *)(pcVar4->m_aabbMinOrg).m_floats = *(undefined8 *)(pcVar2->m_aabbMinOrg).m_floats;
  *(undefined8 *)((pcVar4->m_aabbMinOrg).m_floats + 2) = uVar11;
  *(undefined8 *)(pcVar4->m_aabbMaxOrg).m_floats = uVar12;
  *(undefined8 *)((pcVar4->m_aabbMaxOrg).m_floats + 2) = uVar13;
  pcVar4->m_escapeIndex = iVar23;
  pcVar4->m_subPart = iVar24;
  pcVar4->m_triangleIndex = iVar25;
  pcVar4->m_padding[0] = cVar26;
  pcVar4->m_padding[1] = cVar27;
  pcVar4->m_padding[2] = cVar28;
  pcVar4->m_padding[3] = cVar29;
  *(undefined8 *)(pcVar4->m_padding + 4) = uVar14;
  *(undefined8 *)(pcVar4->m_padding + 0xc) = uVar15;
  pcVar2 = (this->m_leafNodes).m_data + splitIndex;
  *(undefined8 *)(pcVar2->m_aabbMinOrg).m_floats = uVar5;
  *(undefined8 *)((pcVar2->m_aabbMinOrg).m_floats + 2) = uVar6;
  *(undefined8 *)(pcVar2->m_aabbMaxOrg).m_floats = uVar7;
  *(undefined8 *)((pcVar2->m_aabbMaxOrg).m_floats + 2) = uVar8;
  pcVar2->m_escapeIndex = iVar30;
  pcVar2->m_subPart = iVar31;
  pcVar2->m_triangleIndex = iVar32;
  pcVar2->m_padding[0] = cVar33;
  pcVar2->m_padding[1] = cVar34;
  pcVar2->m_padding[2] = cVar35;
  pcVar2->m_padding[3] = cVar36;
  *(undefined8 *)(pcVar2->m_padding + 4) = uVar9;
  *(undefined8 *)(pcVar2->m_padding + 0xc) = uVar10;
  return;
}

Assistant:

void cbtQuantizedBvh::swapLeafNodes(int i, int splitIndex)
{
	if (m_useQuantization)
	{
		cbtQuantizedBvhNode tmp = m_quantizedLeafNodes[i];
		m_quantizedLeafNodes[i] = m_quantizedLeafNodes[splitIndex];
		m_quantizedLeafNodes[splitIndex] = tmp;
	}
	else
	{
		cbtOptimizedBvhNode tmp = m_leafNodes[i];
		m_leafNodes[i] = m_leafNodes[splitIndex];
		m_leafNodes[splitIndex] = tmp;
	}
}